

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::TrustTokenProtocolTest_TruncatedIssuanceRequest_Test::
~TrustTokenProtocolTest_TruncatedIssuanceRequest_Test
          (TrustTokenProtocolTest_TruncatedIssuanceRequest_Test *this)

{
  anon_unknown_0::TrustTokenProtocolTest_TruncatedIssuanceRequest_Test::
  ~TrustTokenProtocolTest_TruncatedIssuanceRequest_Test
            ((TrustTokenProtocolTest_TruncatedIssuanceRequest_Test *)(this + -0x50));
  return;
}

Assistant:

TEST_P(TrustTokenProtocolTest, TruncatedIssuanceRequest) {
  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  msg_len = 10;
  size_t tokens_issued;
  ASSERT_FALSE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      /*public_metadata=*/KeyID(0), /*private_metadata=*/0,
      /*max_issuance=*/10));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);
}